

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void handle_2misc_64(DisasContext_conflict1 *s,int opcode,_Bool u,TCGv_i64 tcg_rd,TCGv_i64 tcg_rn,
                    TCGv_i32 tcg_rmode,TCGv_ptr tcg_fpstatus)

{
  uintptr_t o_4;
  TCGv_i32 pTVar1;
  int nargs;
  uintptr_t o_1;
  TCGCond cond;
  code *pcVar2;
  uintptr_t o;
  uintptr_t o_18;
  TCGv_i64 a2;
  TCGTemp *args [1];
  TCGTemp *local_38;
  TCGTemp *local_30;
  TCGv_i32 local_28;
  
  if (0x39 < opcode) {
    if (opcode < 0x6f) {
      switch(opcode) {
      case 0x58:
        goto switchD_006b5f86_caseD_58;
      case 0x59:
        local_38 = (TCGTemp *)(tcg_rn + (long)s);
        local_30 = (TCGTemp *)(tcg_rmode + (long)s);
        pcVar2 = helper_rintd_exact_aarch64;
        break;
      case 0x5a:
      case 0x5b:
      case 0x5c:
switchD_006b5f86_caseD_5a:
        pTVar1 = tcg_const_i32_aarch64((TCGContext_conflict1 *)s,0);
        pcVar2 = helper_vfp_touqd_aarch64;
        goto LAB_006b608d;
      case 0x5d:
switchD_006b5f86_caseD_5d:
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                   ,0x2638,(char *)0x0);
      case 0x5e:
        goto switchD_006b5f86_caseD_5e;
      case 0x5f:
        goto switchD_006b5f86_caseD_5f;
      default:
        if (1 < opcode - 0x3aU) goto switchD_006b5f86_caseD_5d;
        goto switchD_006b5fbd_caseD_1a;
      }
    }
    else {
      if (opcode < 0x7a) {
        if (opcode == 0x6f) {
          pcVar2 = helper_vfp_negd_aarch64;
          goto LAB_006b615e;
        }
        if (opcode != 0x79) goto switchD_006b5f86_caseD_5d;
        goto switchD_006b5f86_caseD_58;
      }
      if (opcode - 0x7aU < 2) goto switchD_006b5f86_caseD_5a;
      if (opcode != 0x7f) goto switchD_006b5f86_caseD_5d;
      local_30 = (TCGTemp *)(s[0x7d].tmp_a64[5] + (long)s);
      local_38 = (TCGTemp *)(tcg_rn + (long)s);
      pcVar2 = helper_vfp_sqrtd_aarch64;
    }
    goto LAB_006b625e;
  }
  switch(opcode) {
  case 4:
    if (u) {
      tcg_gen_clzi_i64_aarch64((TCGContext_conflict1 *)s,tcg_rd,tcg_rn,0x40);
      return;
    }
    tcg_gen_clrsb_i64_aarch64((TCGContext_conflict1 *)s,tcg_rd,tcg_rn);
    return;
  case 5:
    tcg_gen_not_i64_aarch64((TCGContext_conflict1 *)s,tcg_rd,tcg_rn);
    return;
  case 6:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x1d:
    goto switchD_006b5f86_caseD_5d;
  case 7:
    local_38 = (TCGTemp *)(s[0x7d].tmp_a64[5] + (long)s);
    local_30 = (TCGTemp *)(tcg_rn + (long)s);
    if (u) {
      pcVar2 = helper_neon_qneg_s64_aarch64;
    }
    else {
      pcVar2 = helper_neon_qabs_s64_aarch64;
    }
    break;
  case 8:
    cond = (uint)!u * 8 + TCG_COND_GE;
    goto LAB_006b61c5;
  case 9:
    cond = (uint)u * 2 + TCG_COND_EQ;
    goto LAB_006b61c5;
  case 10:
    cond = TCG_COND_LT;
LAB_006b61c5:
    tcg_gen_setcondi_i64_aarch64((TCGContext_conflict1 *)s,cond,tcg_rd,tcg_rn,0);
    a2 = tcg_rd + (long)s;
LAB_006b61e7:
    tcg_gen_op2_aarch64((TCGContext_conflict1 *)s,INDEX_op_neg_i64,(TCGArg)(tcg_rd + (long)s),
                        (TCGArg)a2);
    return;
  case 0xb:
    if (!u) {
      tcg_gen_abs_i64_aarch64((TCGContext_conflict1 *)s,tcg_rd,tcg_rn);
      return;
    }
    a2 = tcg_rn + (long)s;
    goto LAB_006b61e7;
  case 0x18:
  case 0x19:
    goto switchD_006b5f86_caseD_58;
  case 0x1a:
  case 0x1b:
  case 0x1c:
switchD_006b5fbd_caseD_1a:
    pTVar1 = tcg_const_i32_aarch64((TCGContext_conflict1 *)s,0);
    pcVar2 = helper_vfp_tosqd_aarch64;
LAB_006b608d:
    local_28 = tcg_rmode + (long)s;
    local_38 = (TCGTemp *)(tcg_rn + (long)s);
    local_30 = (TCGTemp *)(pTVar1 + (long)s);
    tcg_gen_callN_aarch64
              ((TCGContext_conflict1 *)s,pcVar2,(TCGTemp *)(tcg_rd + (long)s),3,&local_38);
    tcg_temp_free_internal_aarch64((TCGContext_conflict1 *)s,(TCGTemp *)(pTVar1 + (long)s));
    return;
  case 0x1e:
switchD_006b5f86_caseD_5e:
    local_38 = (TCGTemp *)(tcg_rn + (long)s);
    local_30 = (TCGTemp *)(tcg_rmode + (long)s);
    pcVar2 = helper_frint32_d_aarch64;
    break;
  case 0x1f:
switchD_006b5f86_caseD_5f:
    local_38 = (TCGTemp *)(tcg_rn + (long)s);
    local_30 = (TCGTemp *)(tcg_rmode + (long)s);
    pcVar2 = helper_frint64_d_aarch64;
    break;
  default:
    if (1 < opcode - 0x38U) {
      if (opcode != 0x2f) goto switchD_006b5f86_caseD_5d;
      pcVar2 = helper_vfp_absd_aarch64;
LAB_006b615e:
      local_38 = (TCGTemp *)(tcg_rn + (long)s);
      nargs = 1;
      goto LAB_006b6269;
    }
    goto switchD_006b5f86_caseD_58;
  }
LAB_006b625e:
  nargs = 2;
LAB_006b6269:
  tcg_gen_callN_aarch64
            ((TCGContext_conflict1 *)s,pcVar2,(TCGTemp *)(tcg_rd + (long)s),nargs,&local_38);
  return;
switchD_006b5f86_caseD_58:
  local_38 = (TCGTemp *)(tcg_rn + (long)s);
  local_30 = (TCGTemp *)(tcg_rmode + (long)s);
  pcVar2 = helper_rintd_aarch64;
  goto LAB_006b625e;
}

Assistant:

static void handle_2misc_64(DisasContext *s, int opcode, bool u,
                            TCGv_i64 tcg_rd, TCGv_i64 tcg_rn,
                            TCGv_i32 tcg_rmode, TCGv_ptr tcg_fpstatus)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* Handle 64->64 opcodes which are shared between the scalar and
     * vector 2-reg-misc groups. We cover every integer opcode where size == 3
     * is valid in either group and also the double-precision fp ops.
     * The caller only need provide tcg_rmode and tcg_fpstatus if the op
     * requires them.
     */
    TCGCond cond;

    switch (opcode) {
    case 0x4: /* CLS, CLZ */
        if (u) {
            tcg_gen_clzi_i64(tcg_ctx, tcg_rd, tcg_rn, 64);
        } else {
            tcg_gen_clrsb_i64(tcg_ctx, tcg_rd, tcg_rn);
        }
        break;
    case 0x5: /* NOT */
        /* This opcode is shared with CNT and RBIT but we have earlier
         * enforced that size == 3 if and only if this is the NOT insn.
         */
        tcg_gen_not_i64(tcg_ctx, tcg_rd, tcg_rn);
        break;
    case 0x7: /* SQABS, SQNEG */
        if (u) {
            gen_helper_neon_qneg_s64(tcg_ctx, tcg_rd, tcg_ctx->cpu_env, tcg_rn);
        } else {
            gen_helper_neon_qabs_s64(tcg_ctx, tcg_rd, tcg_ctx->cpu_env, tcg_rn);
        }
        break;
    case 0xa: /* CMLT */
        /* 64 bit integer comparison against zero, result is
         * test ? (2^64 - 1) : 0. We implement via setcond(!test) and
         * subtracting 1.
         */
        cond = TCG_COND_LT;
    do_cmop:
        tcg_gen_setcondi_i64(tcg_ctx, cond, tcg_rd, tcg_rn, 0);
        tcg_gen_neg_i64(tcg_ctx, tcg_rd, tcg_rd);
        break;
    case 0x8: /* CMGT, CMGE */
        cond = u ? TCG_COND_GE : TCG_COND_GT;
        goto do_cmop;
    case 0x9: /* CMEQ, CMLE */
        cond = u ? TCG_COND_LE : TCG_COND_EQ;
        goto do_cmop;
    case 0xb: /* ABS, NEG */
        if (u) {
            tcg_gen_neg_i64(tcg_ctx, tcg_rd, tcg_rn);
        } else {
            tcg_gen_abs_i64(tcg_ctx, tcg_rd, tcg_rn);
        }
        break;
    case 0x2f: /* FABS */
        gen_helper_vfp_absd(tcg_ctx, tcg_rd, tcg_rn);
        break;
    case 0x6f: /* FNEG */
        gen_helper_vfp_negd(tcg_ctx, tcg_rd, tcg_rn);
        break;
    case 0x7f: /* FSQRT */
        gen_helper_vfp_sqrtd(tcg_ctx, tcg_rd, tcg_rn, tcg_ctx->cpu_env);
        break;
    case 0x1a: /* FCVTNS */
    case 0x1b: /* FCVTMS */
    case 0x1c: /* FCVTAS */
    case 0x3a: /* FCVTPS */
    case 0x3b: /* FCVTZS */
    {
        TCGv_i32 tcg_shift = tcg_const_i32(tcg_ctx, 0);
        gen_helper_vfp_tosqd(tcg_ctx, tcg_rd, tcg_rn, tcg_shift, tcg_fpstatus);
        tcg_temp_free_i32(tcg_ctx, tcg_shift);
        break;
    }
    case 0x5a: /* FCVTNU */
    case 0x5b: /* FCVTMU */
    case 0x5c: /* FCVTAU */
    case 0x7a: /* FCVTPU */
    case 0x7b: /* FCVTZU */
    {
        TCGv_i32 tcg_shift = tcg_const_i32(tcg_ctx, 0);
        gen_helper_vfp_touqd(tcg_ctx, tcg_rd, tcg_rn, tcg_shift, tcg_fpstatus);
        tcg_temp_free_i32(tcg_ctx, tcg_shift);
        break;
    }
    case 0x18: /* FRINTN */
    case 0x19: /* FRINTM */
    case 0x38: /* FRINTP */
    case 0x39: /* FRINTZ */
    case 0x58: /* FRINTA */
    case 0x79: /* FRINTI */
        gen_helper_rintd(tcg_ctx, tcg_rd, tcg_rn, tcg_fpstatus);
        break;
    case 0x59: /* FRINTX */
        gen_helper_rintd_exact(tcg_ctx, tcg_rd, tcg_rn, tcg_fpstatus);
        break;
    case 0x1e: /* FRINT32Z */
    case 0x5e: /* FRINT32X */
        gen_helper_frint32_d(tcg_ctx, tcg_rd, tcg_rn, tcg_fpstatus);
        break;
    case 0x1f: /* FRINT64Z */
    case 0x5f: /* FRINT64X */
        gen_helper_frint64_d(tcg_ctx, tcg_rd, tcg_rn, tcg_fpstatus);
        break;
    default:
        g_assert_not_reached();
    }
}